

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::TransformNode::TransformNode(TransformNode *this)

{
  TransformNode *this_local;
  
  Node::Node(&this->super_Node,TransformNodeType);
  (this->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__TransformNode_00164b28;
  mat4::mat4((mat4 *)&(this->super_Node).field_0x34);
  this->m_projectionDepth = 0.0;
  return;
}

Assistant:

TransformNode()
        : Node(TransformNodeType)
        , m_projectionDepth(0)
    {
    }